

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::HairSetNode::HairSetNode
          (HairSetNode *this,Ref<embree::SceneGraph::HairSetNode> *imesh,Transformations *spaces)

{
  long *plVar1;
  long *in_RSI;
  undefined8 *in_RDI;
  Transformations *in_stack_00000090;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_00000098;
  Transformations *in_stack_00000100;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_00000108;
  Transformations *in_stack_00000140;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_00000148;
  undefined8 in_stack_fffffffffffffeb8;
  Node *in_stack_fffffffffffffec0;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *__x;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *this_00;
  
  Node::Node(in_stack_fffffffffffffec0,SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  *in_RDI = &PTR__HairSetNode_00601568;
  in_RDI[0xd] = *(undefined8 *)(*in_RSI + 0x68);
  *(undefined4 *)(in_RDI + 0xe) = *(undefined4 *)(*in_RSI + 0x70);
  transformMSMBlurBuffer<embree::Vec3fx>(in_stack_00000098,in_stack_00000090);
  transformMSMBlurNormalBuffer<embree::Vec3fa>(in_stack_00000148,in_stack_00000140);
  this_00 = (vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             *)(in_RDI + 0x15);
  transformMSMBlurVectorBuffer<embree::Vec3fx>(in_stack_00000098,in_stack_00000090);
  __x = (vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
         *)*in_RSI;
  transformMSMBlurVectorVec3faBuffer<embree::Vec3fa>(in_stack_00000108,in_stack_00000100);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::vector(this_00,__x);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
  plVar1 = in_RDI + 0x21;
  *plVar1 = *(long *)(*in_RSI + 0x108);
  if (*plVar1 != 0) {
    (**(code **)(*(long *)*plVar1 + 0x10))();
  }
  *(undefined4 *)(in_RDI + 0x22) = *(undefined4 *)(*in_RSI + 0x110);
  return;
}

Assistant:

HairSetNode (Ref<SceneGraph::HairSetNode> imesh, const Transformations& spaces)
        : Node(true),
        time_range(imesh->time_range),
        type(imesh->type),
        positions(transformMSMBlurBuffer(imesh->positions,spaces)),
        normals(transformMSMBlurNormalBuffer(imesh->normals,spaces)),
        tangents(transformMSMBlurVectorBuffer(imesh->tangents,spaces)),
        dnormals(transformMSMBlurVectorVec3faBuffer(imesh->dnormals,spaces)),
        hairs(imesh->hairs), flags(imesh->flags), material(imesh->material), tessellation_rate(imesh->tessellation_rate) {}